

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Stress::FenceSyncCase::deinit(FenceSyncCase *this)

{
  ShaderProgram *this_00;
  const_iterator __first;
  const_iterator __last;
  int i;
  long lVar1;
  
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
    this->m_program = (ShaderProgram *)0x0;
  }
  lVar1 = 0;
  while( true ) {
    __first._M_current =
         (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)__last._M_current - (long)__first._M_current) >> 3) <= lVar1) break;
    if (__first._M_current[lVar1] != (GLsync)0x0) {
      glwDeleteSync(__first._M_current[lVar1]);
    }
    lVar1 = lVar1 + 1;
  }
  std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::erase(&this->m_syncObjects,__first,__last);
  return;
}

Assistant:

void FenceSyncCase::deinit (void)
{
	if (m_program)
	{
		delete m_program;
		m_program = DE_NULL;
	}

	for (int i = 0; i < (int)m_syncObjects.size(); i++)
		if (m_syncObjects[i])
			glDeleteSync(m_syncObjects[i]);

	m_syncObjects.erase(m_syncObjects.begin(), m_syncObjects.end());
}